

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covscript.cpp
# Opt level: O0

context_t cs::create_context(array *args)

{
  initializer_list<cs::token_base_*> __l;
  initializer_list<cs::token_base_*> __l_00;
  initializer_list<cs::token_base_*> __l_01;
  initializer_list<cs::token_base_*> __l_02;
  initializer_list<cs::token_base_*> __l_03;
  initializer_list<cs::token_base_*> __l_04;
  initializer_list<cs::token_base_*> __l_05;
  initializer_list<cs::token_base_*> __l_06;
  initializer_list<cs::token_base_*> __l_07;
  initializer_list<cs::token_base_*> __l_08;
  initializer_list<cs::token_base_*> __l_09;
  initializer_list<cs::token_base_*> __l_10;
  initializer_list<cs::token_base_*> __l_11;
  initializer_list<cs::token_base_*> __l_12;
  initializer_list<cs::token_base_*> __l_13;
  initializer_list<cs::token_base_*> __l_14;
  initializer_list<cs::token_base_*> __l_15;
  initializer_list<cs::token_base_*> __l_16;
  initializer_list<cs::token_base_*> __l_17;
  initializer_list<cs::token_base_*> __l_18;
  initializer_list<cs::token_base_*> __l_19;
  initializer_list<cs::token_base_*> __l_20;
  initializer_list<cs::token_base_*> __l_21;
  initializer_list<cs::token_base_*> __l_22;
  initializer_list<cs::token_base_*> __l_23;
  initializer_list<cs::token_base_*> __l_24;
  initializer_list<cs::token_base_*> __l_25;
  initializer_list<cs::token_base_*> __l_26;
  initializer_list<cs::token_base_*> __l_27;
  initializer_list<cs::token_base_*> __l_28;
  initializer_list<cs::token_base_*> __l_29;
  initializer_list<cs::token_base_*> __l_30;
  initializer_list<cs::token_base_*> __l_31;
  initializer_list<cs::token_base_*> __l_32;
  void *pvVar1;
  domain_manager *pdVar2;
  domain_manager *pdVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  context_t cVar4;
  context_t *context;
  shared_ptr<cs::compiler_type> *in_stack_ffffffffffffde98;
  token_action *in_stack_ffffffffffffdea0;
  anon_class_1_0_00000001 *in_stack_ffffffffffffdea8;
  compiler_type *in_stack_ffffffffffffdeb0;
  deque<cs_impl::any,_std::allocator<cs_impl::any>_> *in_stack_ffffffffffffdeb8;
  unsigned_long *in_stack_ffffffffffffdec0;
  allocator_type *in_stack_ffffffffffffdec8;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *in_stack_ffffffffffffded0;
  undefined1 uVar5;
  iterator in_stack_ffffffffffffded8;
  size_type in_stack_ffffffffffffdee0;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *in_stack_ffffffffffffdef0;
  var *var;
  type_index *this;
  domain_manager *this_00;
  type_index *in_stack_ffffffffffffdf18;
  function<cs_impl::any_()> *in_stack_ffffffffffffdf20;
  namespace_t *ext;
  type_index *in_stack_ffffffffffffdf28;
  type_index *this_01;
  domain_manager *in_stack_ffffffffffffdf30;
  function<cs_impl::any_()> *func;
  char (*in_stack_ffffffffffffdf38) [9];
  domain_manager *in_stack_ffffffffffffdf40;
  undefined1 local_1550 [80];
  type_index local_1500 [2];
  namespace_t local_14f0 [3];
  type_index local_14c0 [2];
  domain_manager local_14b0;
  type_index local_1400 [6];
  type_index local_13d0 [6];
  type_index local_13a0 [6];
  type_index local_1370 [6];
  type_index local_1340 [8];
  type_index local_1300 [8];
  type_index local_12c0 [6];
  undefined1 local_1289;
  tree_type<cs::token_base_*> local_1288;
  void *local_1280;
  void *local_1278;
  void *local_1270;
  void **local_1268;
  undefined8 local_1260;
  undefined1 local_1201;
  tree_type<cs::token_base_*> local_1200;
  void *local_11f8;
  void *local_11f0;
  void *local_11e8;
  void **local_11e0;
  undefined8 local_11d8;
  void *local_1178;
  void *local_1170;
  void **local_1168;
  undefined8 local_1160;
  undefined1 local_1101;
  tree_type<cs::token_base_*> local_1100;
  undefined1 local_10f1;
  tree_type<cs::token_base_*> local_10f0;
  void *local_10e8;
  void *local_10e0;
  void *local_10d8;
  void *local_10d0;
  void *local_10c8;
  void **local_10c0;
  undefined8 local_10b8;
  undefined1 local_1059;
  tree_type<cs::token_base_*> local_1058;
  void *local_1050;
  void *local_1048;
  void *local_1040;
  void **local_1038;
  undefined8 local_1030;
  void *local_fd0;
  void *local_fc8;
  void **local_fc0;
  undefined8 local_fb8;
  undefined1 local_f59;
  tree_type<cs::token_base_*> local_f58;
  void *local_f50;
  void *local_f48;
  void *local_f40;
  void **local_f38;
  undefined8 local_f30;
  undefined1 local_ed1;
  tree_type<cs::token_base_*> local_ed0;
  void *local_ec8;
  void *local_ec0;
  void *local_eb8;
  void *local_eb0;
  void **local_ea8;
  undefined8 local_ea0;
  undefined1 local_e41;
  tree_type<cs::token_base_*> local_e40;
  void *local_e38;
  void *local_e30;
  void *local_e28;
  void **local_e20;
  undefined8 local_e18;
  void *local_db8;
  void *local_db0;
  void **local_da8;
  undefined8 local_da0;
  void *local_d40;
  void *local_d38;
  void **local_d30;
  undefined8 local_d28;
  undefined1 local_cc9;
  tree_type<cs::token_base_*> local_cc8;
  undefined1 local_cb9;
  tree_type<cs::token_base_*> local_cb8;
  undefined1 local_ca9;
  tree_type<cs::token_base_*> local_ca8;
  void *local_ca0;
  void *local_c98;
  void *local_c90;
  void *local_c88;
  void *local_c80;
  void *local_c78;
  void *local_c70;
  void **local_c68;
  undefined8 local_c60;
  undefined1 local_c01;
  tree_type<cs::token_base_*> local_c00;
  undefined1 local_bf1;
  tree_type<cs::token_base_*> local_bf0;
  void *local_be8;
  void *local_be0;
  void *local_bd8;
  void *local_bd0;
  void *local_bc8;
  void **local_bc0;
  undefined8 local_bb8;
  undefined1 local_b59;
  tree_type<cs::token_base_*> local_b58;
  undefined1 local_b49;
  tree_type<cs::token_base_*> local_b48;
  void *local_b40;
  void *local_b38;
  void *local_b30;
  void *local_b28;
  void *local_b20;
  void **local_b18;
  undefined8 local_b10;
  undefined1 local_ab1;
  tree_type<cs::token_base_*> local_ab0;
  void *local_aa8;
  void *local_aa0;
  void *local_a98;
  void **local_a90;
  undefined8 local_a88;
  void *local_a28;
  void *local_a20;
  void **local_a18;
  undefined8 local_a10;
  undefined1 local_9b1;
  tree_type<cs::token_base_*> local_9b0;
  void *local_9a8;
  void *local_9a0;
  void *local_998;
  void **local_990;
  undefined8 local_988;
  undefined1 local_929;
  tree_type<cs::token_base_*> local_928;
  void *local_920;
  void *local_918;
  void *local_910;
  void **local_908;
  undefined8 local_900;
  void *local_8a0;
  void *local_898;
  void **local_890;
  undefined8 local_888;
  undefined1 local_829;
  tree_type<cs::token_base_*> local_828;
  void *local_820;
  void *local_818;
  void *local_810;
  void **local_808;
  undefined8 local_800;
  undefined1 local_7a1;
  tree_type<cs::token_base_*> local_7a0;
  void *local_798;
  void *local_790;
  void *local_788;
  void **local_780;
  undefined8 local_778;
  void *local_718;
  void *local_710;
  void **local_708;
  undefined8 local_700;
  undefined1 local_6a1;
  tree_type<cs::token_base_*> local_6a0;
  void *local_698;
  void *local_690;
  void *local_688;
  void **local_680;
  undefined8 local_678;
  undefined1 local_619;
  tree_type<cs::token_base_*> local_618;
  void *local_610;
  void *local_608;
  void *local_600;
  void **local_5f8;
  undefined8 local_5f0;
  void *local_590;
  void *local_588;
  void **local_580;
  undefined8 local_578;
  void *local_518;
  void *local_510;
  void **local_508;
  undefined8 local_500;
  undefined1 local_4a1;
  tree_type<cs::token_base_*> local_4a0;
  void *local_498;
  void *local_490;
  void *local_488;
  void **local_480;
  undefined8 local_478;
  undefined1 local_419;
  tree_type<cs::token_base_*> local_418;
  void *local_410;
  void *local_408;
  void *local_400;
  void **local_3f8;
  undefined8 local_3f0;
  undefined1 local_391;
  tree_type<cs::token_base_*> local_390;
  void *local_388;
  void *local_380;
  void *local_378;
  void **local_370;
  undefined8 local_368;
  undefined1 local_309;
  tree_type<cs::token_base_*> local_308;
  void *local_300;
  void *local_2f8;
  void *local_2f0;
  void **local_2e8;
  undefined8 local_2e0;
  undefined1 local_281;
  tree_type<cs::token_base_*> local_280;
  void *local_278;
  void *local_270;
  void *local_268;
  void **local_260;
  undefined8 local_258;
  undefined1 local_1f9;
  tree_type<cs::token_base_*> local_1f8;
  undefined1 local_1e9;
  tree_type<cs::token_base_*> local_1e8;
  void *local_1e0;
  void *local_1d8;
  void *local_1d0;
  void *local_1c8;
  void *local_1c0;
  void **local_1b8;
  undefined8 local_1b0;
  undefined1 local_151;
  tree_type<cs::token_base_*> local_150;
  void *local_148;
  void *local_140;
  void *local_138;
  void **local_130;
  undefined8 local_128;
  undefined1 local_c9;
  tree_type<cs::token_base_*> local_c8;
  void *local_c0;
  void *local_b8;
  void **local_b0;
  undefined8 local_a8;
  undefined1 local_11;
  
  cs_impl::init_extensions((cs_impl *)in_RDI);
  local_11 = 0;
  std::make_shared<cs::context_type>();
  std::make_shared<cs::compiler_type,std::shared_ptr<cs::context_type>&>
            ((shared_ptr<cs::context_type> *)in_stack_ffffffffffffdec8);
  std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x216c68);
  std::shared_ptr<cs::compiler_type>::operator=
            ((shared_ptr<cs::compiler_type> *)in_stack_ffffffffffffdea0,in_stack_ffffffffffffde98);
  std::shared_ptr<cs::compiler_type>::~shared_ptr((shared_ptr<cs::compiler_type> *)0x216c8d);
  std::make_shared<cs::instance_type,std::shared_ptr<cs::context_type>&,unsigned_long&>
            ((shared_ptr<cs::context_type> *)in_stack_ffffffffffffdec8,in_stack_ffffffffffffdec0);
  std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x216cbf);
  std::shared_ptr<cs::instance_type>::operator=
            ((shared_ptr<cs::instance_type> *)in_stack_ffffffffffffdea0,
             (shared_ptr<cs::instance_type> *)in_stack_ffffffffffffde98);
  std::shared_ptr<cs::instance_type>::~shared_ptr((shared_ptr<cs::instance_type> *)0x216ce8);
  cs_impl::any::
  make_constant<std::deque<cs_impl::any,std::allocator<cs_impl::any>>,std::deque<cs_impl::any,std::allocator<cs_impl::any>>const&>
            (in_stack_ffffffffffffdeb8);
  std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x216d0c);
  cs_impl::any::operator=((any *)in_stack_ffffffffffffdea0,(any *)in_stack_ffffffffffffde98);
  cs_impl::any::~any((any *)0x216d38);
  std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x216d45);
  std::__shared_ptr_access<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
            ((__shared_ptr_access<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffdea0);
  pvVar1 = token_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  local_c9 = 1;
  local_c8.mRoot = (tree_node *)0x0;
  tree_type<cs::token_base_*>::tree_type(&local_c8);
  token_expr::token_expr
            ((token_expr *)in_stack_ffffffffffffdeb0,
             (tree_type<cs::token_base_*> *)in_stack_ffffffffffffdea8);
  local_c9 = 0;
  local_c0 = pvVar1;
  pvVar1 = token_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  token_endline::token_endline
            ((token_endline *)in_stack_ffffffffffffdea0,(size_t)in_stack_ffffffffffffde98);
  local_b0 = &local_c0;
  local_a8 = 2;
  local_b8 = pvVar1;
  std::allocator<cs::token_base_*>::allocator((allocator<cs::token_base_*> *)0x216e3c);
  __l._M_len = in_stack_ffffffffffffdee0;
  __l._M_array = in_stack_ffffffffffffded8;
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::deque
            (in_stack_ffffffffffffded0,__l,in_stack_ffffffffffffdec8);
  method_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  method_expression::method_expression((method_expression *)in_stack_ffffffffffffdea0);
  compiler_type::add_method
            (in_stack_ffffffffffffdeb0,
             (deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)in_stack_ffffffffffffdea8
             ,(method_base *)in_stack_ffffffffffffdea0);
  pvVar1 = token_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  token_action::token_action
            (in_stack_ffffffffffffdea0,(action_types)((ulong)in_stack_ffffffffffffde98 >> 0x20));
  local_148 = pvVar1;
  pvVar1 = token_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  local_151 = 1;
  local_150.mRoot = (tree_node *)0x0;
  tree_type<cs::token_base_*>::tree_type(&local_150);
  token_expr::token_expr
            ((token_expr *)in_stack_ffffffffffffdeb0,
             (tree_type<cs::token_base_*> *)in_stack_ffffffffffffdea8);
  local_151 = 0;
  local_140 = pvVar1;
  pvVar1 = token_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  token_endline::token_endline
            ((token_endline *)in_stack_ffffffffffffdea0,(size_t)in_stack_ffffffffffffde98);
  local_130 = &local_148;
  local_128 = 3;
  local_138 = pvVar1;
  std::allocator<cs::token_base_*>::allocator((allocator<cs::token_base_*> *)0x216fda);
  __l_00._M_len = in_stack_ffffffffffffdee0;
  __l_00._M_array = in_stack_ffffffffffffded8;
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::deque
            (in_stack_ffffffffffffded0,__l_00,in_stack_ffffffffffffdec8);
  method_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  method_import::method_import((method_import *)in_stack_ffffffffffffdeb0);
  compiler_type::add_method
            (in_stack_ffffffffffffdeb0,
             (deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)in_stack_ffffffffffffdea8
             ,(method_base *)in_stack_ffffffffffffdea0);
  pvVar1 = token_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  token_action::token_action
            (in_stack_ffffffffffffdea0,(action_types)((ulong)in_stack_ffffffffffffde98 >> 0x20));
  local_1e0 = pvVar1;
  pvVar1 = token_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  local_1e9 = 1;
  local_1e8.mRoot = (tree_node *)0x0;
  tree_type<cs::token_base_*>::tree_type(&local_1e8);
  token_expr::token_expr
            ((token_expr *)in_stack_ffffffffffffdeb0,
             (tree_type<cs::token_base_*> *)in_stack_ffffffffffffdea8);
  local_1e9 = 0;
  local_1d8 = pvVar1;
  pvVar1 = token_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  token_action::token_action
            (in_stack_ffffffffffffdea0,(action_types)((ulong)in_stack_ffffffffffffde98 >> 0x20));
  local_1d0 = pvVar1;
  pvVar1 = token_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  local_1f9 = 1;
  local_1f8.mRoot = (tree_node *)0x0;
  tree_type<cs::token_base_*>::tree_type(&local_1f8);
  token_expr::token_expr
            ((token_expr *)in_stack_ffffffffffffdeb0,
             (tree_type<cs::token_base_*> *)in_stack_ffffffffffffdea8);
  local_1f9 = 0;
  local_1c8 = pvVar1;
  pvVar1 = token_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  token_endline::token_endline
            ((token_endline *)in_stack_ffffffffffffdea0,(size_t)in_stack_ffffffffffffde98);
  local_1b8 = &local_1e0;
  local_1b0 = 5;
  local_1c0 = pvVar1;
  std::allocator<cs::token_base_*>::allocator((allocator<cs::token_base_*> *)0x217244);
  __l_01._M_len = in_stack_ffffffffffffdee0;
  __l_01._M_array = in_stack_ffffffffffffded8;
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::deque
            (in_stack_ffffffffffffded0,__l_01,in_stack_ffffffffffffdec8);
  method_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  method_import_as::method_import_as((method_import_as *)in_stack_ffffffffffffdeb0);
  compiler_type::add_method
            (in_stack_ffffffffffffdeb0,
             (deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)in_stack_ffffffffffffdea8
             ,(method_base *)in_stack_ffffffffffffdea0);
  pvVar1 = token_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  token_action::token_action
            (in_stack_ffffffffffffdea0,(action_types)((ulong)in_stack_ffffffffffffde98 >> 0x20));
  local_278 = pvVar1;
  pvVar1 = token_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  local_281 = 1;
  local_280.mRoot = (tree_node *)0x0;
  tree_type<cs::token_base_*>::tree_type(&local_280);
  token_expr::token_expr
            ((token_expr *)in_stack_ffffffffffffdeb0,
             (tree_type<cs::token_base_*> *)in_stack_ffffffffffffdea8);
  local_281 = 0;
  local_270 = pvVar1;
  pvVar1 = token_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  token_endline::token_endline
            ((token_endline *)in_stack_ffffffffffffdea0,(size_t)in_stack_ffffffffffffde98);
  local_260 = &local_278;
  local_258 = 3;
  local_268 = pvVar1;
  std::allocator<cs::token_base_*>::allocator((allocator<cs::token_base_*> *)0x2173e7);
  __l_02._M_len = in_stack_ffffffffffffdee0;
  __l_02._M_array = in_stack_ffffffffffffded8;
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::deque
            (in_stack_ffffffffffffded0,__l_02,in_stack_ffffffffffffdec8);
  method_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  method_package::method_package((method_package *)in_stack_ffffffffffffdea0);
  compiler_type::add_method
            (in_stack_ffffffffffffdeb0,
             (deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)in_stack_ffffffffffffdea8
             ,(method_base *)in_stack_ffffffffffffdea0);
  pvVar1 = token_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  token_action::token_action
            (in_stack_ffffffffffffdea0,(action_types)((ulong)in_stack_ffffffffffffde98 >> 0x20));
  local_300 = pvVar1;
  pvVar1 = token_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  local_309 = 1;
  local_308.mRoot = (tree_node *)0x0;
  tree_type<cs::token_base_*>::tree_type(&local_308);
  token_expr::token_expr
            ((token_expr *)in_stack_ffffffffffffdeb0,
             (tree_type<cs::token_base_*> *)in_stack_ffffffffffffdea8);
  local_309 = 0;
  local_2f8 = pvVar1;
  pvVar1 = token_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  token_endline::token_endline
            ((token_endline *)in_stack_ffffffffffffdea0,(size_t)in_stack_ffffffffffffde98);
  local_2e8 = &local_300;
  local_2e0 = 3;
  local_2f0 = pvVar1;
  std::allocator<cs::token_base_*>::allocator((allocator<cs::token_base_*> *)0x217588);
  __l_03._M_len = in_stack_ffffffffffffdee0;
  __l_03._M_array = in_stack_ffffffffffffded8;
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::deque
            (in_stack_ffffffffffffded0,__l_03,in_stack_ffffffffffffdec8);
  method_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  method_involve::method_involve((method_involve *)in_stack_ffffffffffffdeb0);
  compiler_type::add_method
            (in_stack_ffffffffffffdeb0,
             (deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)in_stack_ffffffffffffdea8
             ,(method_base *)in_stack_ffffffffffffdea0);
  pvVar1 = token_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  token_action::token_action
            (in_stack_ffffffffffffdea0,(action_types)((ulong)in_stack_ffffffffffffde98 >> 0x20));
  local_388 = pvVar1;
  pvVar1 = token_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  local_391 = 1;
  local_390.mRoot = (tree_node *)0x0;
  tree_type<cs::token_base_*>::tree_type(&local_390);
  token_expr::token_expr
            ((token_expr *)in_stack_ffffffffffffdeb0,
             (tree_type<cs::token_base_*> *)in_stack_ffffffffffffdea8);
  local_391 = 0;
  local_380 = pvVar1;
  pvVar1 = token_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  token_endline::token_endline
            ((token_endline *)in_stack_ffffffffffffdea0,(size_t)in_stack_ffffffffffffde98);
  local_370 = &local_388;
  local_368 = 3;
  local_378 = pvVar1;
  std::allocator<cs::token_base_*>::allocator((allocator<cs::token_base_*> *)0x21772b);
  __l_04._M_len = in_stack_ffffffffffffdee0;
  __l_04._M_array = in_stack_ffffffffffffded8;
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::deque
            (in_stack_ffffffffffffded0,__l_04,in_stack_ffffffffffffdec8);
  method_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  method_var::method_var((method_var *)in_stack_ffffffffffffdea0);
  compiler_type::add_method
            (in_stack_ffffffffffffdeb0,
             (deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)in_stack_ffffffffffffdea8
             ,(method_base *)in_stack_ffffffffffffdea0);
  pvVar1 = token_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  token_action::token_action
            (in_stack_ffffffffffffdea0,(action_types)((ulong)in_stack_ffffffffffffde98 >> 0x20));
  local_410 = pvVar1;
  pvVar1 = token_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  local_419 = 1;
  local_418.mRoot = (tree_node *)0x0;
  tree_type<cs::token_base_*>::tree_type(&local_418);
  token_expr::token_expr
            ((token_expr *)in_stack_ffffffffffffdeb0,
             (tree_type<cs::token_base_*> *)in_stack_ffffffffffffdea8);
  local_419 = 0;
  local_408 = pvVar1;
  pvVar1 = token_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  token_endline::token_endline
            ((token_endline *)in_stack_ffffffffffffdea0,(size_t)in_stack_ffffffffffffde98);
  local_3f8 = &local_410;
  local_3f0 = 3;
  local_400 = pvVar1;
  std::allocator<cs::token_base_*>::allocator((allocator<cs::token_base_*> *)0x2178cc);
  __l_05._M_len = in_stack_ffffffffffffdee0;
  __l_05._M_array = in_stack_ffffffffffffded8;
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::deque
            (in_stack_ffffffffffffded0,__l_05,in_stack_ffffffffffffdec8);
  method_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  method_link::method_link((method_link *)in_stack_ffffffffffffdea0);
  compiler_type::add_method
            (in_stack_ffffffffffffdeb0,
             (deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)in_stack_ffffffffffffdea8
             ,(method_base *)in_stack_ffffffffffffdea0);
  pvVar1 = token_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  token_action::token_action
            (in_stack_ffffffffffffdea0,(action_types)((ulong)in_stack_ffffffffffffde98 >> 0x20));
  local_498 = pvVar1;
  pvVar1 = token_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  local_4a1 = 1;
  local_4a0.mRoot = (tree_node *)0x0;
  tree_type<cs::token_base_*>::tree_type(&local_4a0);
  token_expr::token_expr
            ((token_expr *)in_stack_ffffffffffffdeb0,
             (tree_type<cs::token_base_*> *)in_stack_ffffffffffffdea8);
  local_4a1 = 0;
  local_490 = pvVar1;
  pvVar1 = token_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  token_endline::token_endline
            ((token_endline *)in_stack_ffffffffffffdea0,(size_t)in_stack_ffffffffffffde98);
  local_480 = &local_498;
  local_478 = 3;
  local_488 = pvVar1;
  std::allocator<cs::token_base_*>::allocator((allocator<cs::token_base_*> *)0x217a6d);
  __l_06._M_len = in_stack_ffffffffffffdee0;
  __l_06._M_array = in_stack_ffffffffffffded8;
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::deque
            (in_stack_ffffffffffffded0,__l_06,in_stack_ffffffffffffdec8);
  method_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  method_constant::method_constant((method_constant *)in_stack_ffffffffffffdea0);
  compiler_type::add_method
            (in_stack_ffffffffffffdeb0,
             (deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)in_stack_ffffffffffffdea8
             ,(method_base *)in_stack_ffffffffffffdea0);
  pvVar1 = token_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  token_action::token_action
            (in_stack_ffffffffffffdea0,(action_types)((ulong)in_stack_ffffffffffffde98 >> 0x20));
  local_518 = pvVar1;
  pvVar1 = token_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  token_endline::token_endline
            ((token_endline *)in_stack_ffffffffffffdea0,(size_t)in_stack_ffffffffffffde98);
  local_508 = &local_518;
  local_500 = 2;
  local_510 = pvVar1;
  std::allocator<cs::token_base_*>::allocator((allocator<cs::token_base_*> *)0x217b8f);
  __l_07._M_len = in_stack_ffffffffffffdee0;
  __l_07._M_array = in_stack_ffffffffffffded8;
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::deque
            (in_stack_ffffffffffffded0,__l_07,in_stack_ffffffffffffdec8);
  method_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  method_end::method_end((method_end *)in_stack_ffffffffffffdea0);
  compiler_type::add_method
            (in_stack_ffffffffffffdeb0,
             (deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)in_stack_ffffffffffffdea8
             ,(method_base *)in_stack_ffffffffffffdea0);
  pvVar1 = token_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  token_action::token_action
            (in_stack_ffffffffffffdea0,(action_types)((ulong)in_stack_ffffffffffffde98 >> 0x20));
  local_590 = pvVar1;
  pvVar1 = token_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  token_endline::token_endline
            ((token_endline *)in_stack_ffffffffffffdea0,(size_t)in_stack_ffffffffffffde98);
  local_580 = &local_590;
  local_578 = 2;
  local_588 = pvVar1;
  std::allocator<cs::token_base_*>::allocator((allocator<cs::token_base_*> *)0x217cb1);
  __l_08._M_len = in_stack_ffffffffffffdee0;
  __l_08._M_array = in_stack_ffffffffffffded8;
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::deque
            (in_stack_ffffffffffffded0,__l_08,in_stack_ffffffffffffdec8);
  method_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  method_block::method_block((method_block *)in_stack_ffffffffffffdea0);
  compiler_type::add_method
            (in_stack_ffffffffffffdeb0,
             (deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)in_stack_ffffffffffffdea8
             ,(method_base *)in_stack_ffffffffffffdea0);
  pvVar1 = token_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  token_action::token_action
            (in_stack_ffffffffffffdea0,(action_types)((ulong)in_stack_ffffffffffffde98 >> 0x20));
  local_610 = pvVar1;
  pvVar1 = token_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  local_619 = 1;
  local_618.mRoot = (tree_node *)0x0;
  tree_type<cs::token_base_*>::tree_type(&local_618);
  token_expr::token_expr
            ((token_expr *)in_stack_ffffffffffffdeb0,
             (tree_type<cs::token_base_*> *)in_stack_ffffffffffffdea8);
  local_619 = 0;
  local_608 = pvVar1;
  pvVar1 = token_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  token_endline::token_endline
            ((token_endline *)in_stack_ffffffffffffdea0,(size_t)in_stack_ffffffffffffde98);
  local_5f8 = &local_610;
  local_5f0 = 3;
  local_600 = pvVar1;
  std::allocator<cs::token_base_*>::allocator((allocator<cs::token_base_*> *)0x217e52);
  __l_09._M_len = in_stack_ffffffffffffdee0;
  __l_09._M_array = in_stack_ffffffffffffded8;
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::deque
            (in_stack_ffffffffffffded0,__l_09,in_stack_ffffffffffffdec8);
  method_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  method_namespace::method_namespace((method_namespace *)in_stack_ffffffffffffdea0);
  compiler_type::add_method
            (in_stack_ffffffffffffdeb0,
             (deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)in_stack_ffffffffffffdea8
             ,(method_base *)in_stack_ffffffffffffdea0);
  pvVar1 = token_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  token_action::token_action
            (in_stack_ffffffffffffdea0,(action_types)((ulong)in_stack_ffffffffffffde98 >> 0x20));
  local_698 = pvVar1;
  pvVar1 = token_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  local_6a1 = 1;
  local_6a0.mRoot = (tree_node *)0x0;
  tree_type<cs::token_base_*>::tree_type(&local_6a0);
  token_expr::token_expr
            ((token_expr *)in_stack_ffffffffffffdeb0,
             (tree_type<cs::token_base_*> *)in_stack_ffffffffffffdea8);
  local_6a1 = 0;
  local_690 = pvVar1;
  pvVar1 = token_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  token_endline::token_endline
            ((token_endline *)in_stack_ffffffffffffdea0,(size_t)in_stack_ffffffffffffde98);
  local_680 = &local_698;
  local_678 = 3;
  local_688 = pvVar1;
  std::allocator<cs::token_base_*>::allocator((allocator<cs::token_base_*> *)0x217ff3);
  __l_10._M_len = in_stack_ffffffffffffdee0;
  __l_10._M_array = in_stack_ffffffffffffded8;
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::deque
            (in_stack_ffffffffffffded0,__l_10,in_stack_ffffffffffffdec8);
  method_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  method_if::method_if((method_if *)in_stack_ffffffffffffdea0);
  compiler_type::add_method
            (in_stack_ffffffffffffdeb0,
             (deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)in_stack_ffffffffffffdea8
             ,(method_base *)in_stack_ffffffffffffdea0);
  pvVar1 = token_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  token_action::token_action
            (in_stack_ffffffffffffdea0,(action_types)((ulong)in_stack_ffffffffffffde98 >> 0x20));
  local_718 = pvVar1;
  pvVar1 = token_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  token_endline::token_endline
            ((token_endline *)in_stack_ffffffffffffdea0,(size_t)in_stack_ffffffffffffde98);
  local_708 = &local_718;
  local_700 = 2;
  local_710 = pvVar1;
  std::allocator<cs::token_base_*>::allocator((allocator<cs::token_base_*> *)0x218115);
  __l_11._M_len = in_stack_ffffffffffffdee0;
  __l_11._M_array = in_stack_ffffffffffffded8;
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::deque
            (in_stack_ffffffffffffded0,__l_11,in_stack_ffffffffffffdec8);
  method_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  method_else::method_else((method_else *)in_stack_ffffffffffffdea0);
  compiler_type::add_method
            (in_stack_ffffffffffffdeb0,
             (deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)in_stack_ffffffffffffdea8
             ,(method_base *)in_stack_ffffffffffffdea0);
  pvVar1 = token_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  token_action::token_action
            (in_stack_ffffffffffffdea0,(action_types)((ulong)in_stack_ffffffffffffde98 >> 0x20));
  local_798 = pvVar1;
  pvVar1 = token_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  local_7a1 = 1;
  local_7a0.mRoot = (tree_node *)0x0;
  tree_type<cs::token_base_*>::tree_type(&local_7a0);
  token_expr::token_expr
            ((token_expr *)in_stack_ffffffffffffdeb0,
             (tree_type<cs::token_base_*> *)in_stack_ffffffffffffdea8);
  local_7a1 = 0;
  local_790 = pvVar1;
  pvVar1 = token_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  token_endline::token_endline
            ((token_endline *)in_stack_ffffffffffffdea0,(size_t)in_stack_ffffffffffffde98);
  local_780 = &local_798;
  local_778 = 3;
  local_788 = pvVar1;
  std::allocator<cs::token_base_*>::allocator((allocator<cs::token_base_*> *)0x2182b6);
  __l_12._M_len = in_stack_ffffffffffffdee0;
  __l_12._M_array = in_stack_ffffffffffffded8;
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::deque
            (in_stack_ffffffffffffded0,__l_12,in_stack_ffffffffffffdec8);
  method_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  method_switch::method_switch((method_switch *)in_stack_ffffffffffffdea0);
  compiler_type::add_method
            (in_stack_ffffffffffffdeb0,
             (deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)in_stack_ffffffffffffdea8
             ,(method_base *)in_stack_ffffffffffffdea0);
  pvVar1 = token_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  token_action::token_action
            (in_stack_ffffffffffffdea0,(action_types)((ulong)in_stack_ffffffffffffde98 >> 0x20));
  local_820 = pvVar1;
  pvVar1 = token_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  local_829 = 1;
  local_828.mRoot = (tree_node *)0x0;
  tree_type<cs::token_base_*>::tree_type(&local_828);
  token_expr::token_expr
            ((token_expr *)in_stack_ffffffffffffdeb0,
             (tree_type<cs::token_base_*> *)in_stack_ffffffffffffdea8);
  local_829 = 0;
  local_818 = pvVar1;
  pvVar1 = token_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  token_endline::token_endline
            ((token_endline *)in_stack_ffffffffffffdea0,(size_t)in_stack_ffffffffffffde98);
  local_808 = &local_820;
  local_800 = 3;
  local_810 = pvVar1;
  std::allocator<cs::token_base_*>::allocator((allocator<cs::token_base_*> *)0x218457);
  __l_13._M_len = in_stack_ffffffffffffdee0;
  __l_13._M_array = in_stack_ffffffffffffded8;
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::deque
            (in_stack_ffffffffffffded0,__l_13,in_stack_ffffffffffffdec8);
  method_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  method_case::method_case((method_case *)in_stack_ffffffffffffdea0);
  compiler_type::add_method
            (in_stack_ffffffffffffdeb0,
             (deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)in_stack_ffffffffffffdea8
             ,(method_base *)in_stack_ffffffffffffdea0);
  pvVar1 = token_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  token_action::token_action
            (in_stack_ffffffffffffdea0,(action_types)((ulong)in_stack_ffffffffffffde98 >> 0x20));
  local_8a0 = pvVar1;
  pvVar1 = token_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  token_endline::token_endline
            ((token_endline *)in_stack_ffffffffffffdea0,(size_t)in_stack_ffffffffffffde98);
  local_890 = &local_8a0;
  local_888 = 2;
  local_898 = pvVar1;
  std::allocator<cs::token_base_*>::allocator((allocator<cs::token_base_*> *)0x218579);
  __l_14._M_len = in_stack_ffffffffffffdee0;
  __l_14._M_array = in_stack_ffffffffffffded8;
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::deque
            (in_stack_ffffffffffffded0,__l_14,in_stack_ffffffffffffdec8);
  method_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  method_default::method_default((method_default *)in_stack_ffffffffffffdea0);
  compiler_type::add_method
            (in_stack_ffffffffffffdeb0,
             (deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)in_stack_ffffffffffffdea8
             ,(method_base *)in_stack_ffffffffffffdea0);
  pvVar1 = token_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  token_action::token_action
            (in_stack_ffffffffffffdea0,(action_types)((ulong)in_stack_ffffffffffffde98 >> 0x20));
  local_920 = pvVar1;
  pvVar1 = token_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  local_929 = 1;
  local_928.mRoot = (tree_node *)0x0;
  tree_type<cs::token_base_*>::tree_type(&local_928);
  token_expr::token_expr
            ((token_expr *)in_stack_ffffffffffffdeb0,
             (tree_type<cs::token_base_*> *)in_stack_ffffffffffffdea8);
  local_929 = 0;
  local_918 = pvVar1;
  pvVar1 = token_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  token_endline::token_endline
            ((token_endline *)in_stack_ffffffffffffdea0,(size_t)in_stack_ffffffffffffde98);
  local_908 = &local_920;
  local_900 = 3;
  local_910 = pvVar1;
  std::allocator<cs::token_base_*>::allocator((allocator<cs::token_base_*> *)0x21871a);
  __l_15._M_len = in_stack_ffffffffffffdee0;
  __l_15._M_array = in_stack_ffffffffffffded8;
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::deque
            (in_stack_ffffffffffffded0,__l_15,in_stack_ffffffffffffdec8);
  method_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  method_while::method_while((method_while *)in_stack_ffffffffffffdea0);
  compiler_type::add_method
            (in_stack_ffffffffffffdeb0,
             (deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)in_stack_ffffffffffffdea8
             ,(method_base *)in_stack_ffffffffffffdea0);
  pvVar1 = token_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  token_action::token_action
            (in_stack_ffffffffffffdea0,(action_types)((ulong)in_stack_ffffffffffffde98 >> 0x20));
  local_9a8 = pvVar1;
  pvVar1 = token_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  local_9b1 = 1;
  local_9b0.mRoot = (tree_node *)0x0;
  tree_type<cs::token_base_*>::tree_type(&local_9b0);
  token_expr::token_expr
            ((token_expr *)in_stack_ffffffffffffdeb0,
             (tree_type<cs::token_base_*> *)in_stack_ffffffffffffdea8);
  local_9b1 = 0;
  local_9a0 = pvVar1;
  pvVar1 = token_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  token_endline::token_endline
            ((token_endline *)in_stack_ffffffffffffdea0,(size_t)in_stack_ffffffffffffde98);
  local_990 = &local_9a8;
  local_988 = 3;
  local_998 = pvVar1;
  std::allocator<cs::token_base_*>::allocator((allocator<cs::token_base_*> *)0x2188bb);
  __l_16._M_len = in_stack_ffffffffffffdee0;
  __l_16._M_array = in_stack_ffffffffffffded8;
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::deque
            (in_stack_ffffffffffffded0,__l_16,in_stack_ffffffffffffdec8);
  method_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  method_until::method_until((method_until *)in_stack_ffffffffffffdea0);
  compiler_type::add_method
            (in_stack_ffffffffffffdeb0,
             (deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)in_stack_ffffffffffffdea8
             ,(method_base *)in_stack_ffffffffffffdea0);
  pvVar1 = token_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  token_action::token_action
            (in_stack_ffffffffffffdea0,(action_types)((ulong)in_stack_ffffffffffffde98 >> 0x20));
  local_a28 = pvVar1;
  pvVar1 = token_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  token_endline::token_endline
            ((token_endline *)in_stack_ffffffffffffdea0,(size_t)in_stack_ffffffffffffde98);
  local_a18 = &local_a28;
  local_a10 = 2;
  local_a20 = pvVar1;
  std::allocator<cs::token_base_*>::allocator((allocator<cs::token_base_*> *)0x2189dd);
  __l_17._M_len = in_stack_ffffffffffffdee0;
  __l_17._M_array = in_stack_ffffffffffffded8;
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::deque
            (in_stack_ffffffffffffded0,__l_17,in_stack_ffffffffffffdec8);
  method_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  method_loop::method_loop((method_loop *)in_stack_ffffffffffffdea0);
  compiler_type::add_method
            (in_stack_ffffffffffffdeb0,
             (deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)in_stack_ffffffffffffdea8
             ,(method_base *)in_stack_ffffffffffffdea0);
  pvVar1 = token_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  token_action::token_action
            (in_stack_ffffffffffffdea0,(action_types)((ulong)in_stack_ffffffffffffde98 >> 0x20));
  local_aa8 = pvVar1;
  pvVar1 = token_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  local_ab1 = 1;
  local_ab0.mRoot = (tree_node *)0x0;
  tree_type<cs::token_base_*>::tree_type(&local_ab0);
  token_expr::token_expr
            ((token_expr *)in_stack_ffffffffffffdeb0,
             (tree_type<cs::token_base_*> *)in_stack_ffffffffffffdea8);
  local_ab1 = 0;
  local_aa0 = pvVar1;
  pvVar1 = token_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  token_endline::token_endline
            ((token_endline *)in_stack_ffffffffffffdea0,(size_t)in_stack_ffffffffffffde98);
  local_a90 = &local_aa8;
  local_a88 = 3;
  local_a98 = pvVar1;
  std::allocator<cs::token_base_*>::allocator((allocator<cs::token_base_*> *)0x218b7e);
  __l_18._M_len = in_stack_ffffffffffffdee0;
  __l_18._M_array = in_stack_ffffffffffffded8;
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::deque
            (in_stack_ffffffffffffded0,__l_18,in_stack_ffffffffffffdec8);
  method_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  method_for::method_for((method_for *)in_stack_ffffffffffffdea0);
  compiler_type::add_method
            (in_stack_ffffffffffffdeb0,
             (deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)in_stack_ffffffffffffdea8
             ,(method_base *)in_stack_ffffffffffffdea0);
  pvVar1 = token_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  token_action::token_action
            (in_stack_ffffffffffffdea0,(action_types)((ulong)in_stack_ffffffffffffde98 >> 0x20));
  local_b40 = pvVar1;
  pvVar1 = token_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  local_b49 = 1;
  local_b48.mRoot = (tree_node *)0x0;
  tree_type<cs::token_base_*>::tree_type(&local_b48);
  token_expr::token_expr
            ((token_expr *)in_stack_ffffffffffffdeb0,
             (tree_type<cs::token_base_*> *)in_stack_ffffffffffffdea8);
  local_b49 = 0;
  local_b38 = pvVar1;
  pvVar1 = token_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  token_action::token_action
            (in_stack_ffffffffffffdea0,(action_types)((ulong)in_stack_ffffffffffffde98 >> 0x20));
  local_b30 = pvVar1;
  pvVar1 = token_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  local_b59 = 1;
  local_b58.mRoot = (tree_node *)0x0;
  tree_type<cs::token_base_*>::tree_type(&local_b58);
  token_expr::token_expr
            ((token_expr *)in_stack_ffffffffffffdeb0,
             (tree_type<cs::token_base_*> *)in_stack_ffffffffffffdea8);
  local_b59 = 0;
  local_b28 = pvVar1;
  pvVar1 = token_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  token_endline::token_endline
            ((token_endline *)in_stack_ffffffffffffdea0,(size_t)in_stack_ffffffffffffde98);
  local_b18 = &local_b40;
  local_b10 = 5;
  local_b20 = pvVar1;
  std::allocator<cs::token_base_*>::allocator((allocator<cs::token_base_*> *)0x218de9);
  __l_19._M_len = in_stack_ffffffffffffdee0;
  __l_19._M_array = in_stack_ffffffffffffded8;
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::deque
            (in_stack_ffffffffffffded0,__l_19,in_stack_ffffffffffffdec8);
  method_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  method_for_do::method_for_do((method_for_do *)in_stack_ffffffffffffdea0);
  compiler_type::add_method
            (in_stack_ffffffffffffdeb0,
             (deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)in_stack_ffffffffffffdea8
             ,(method_base *)in_stack_ffffffffffffdea0);
  pvVar1 = token_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  token_action::token_action
            (in_stack_ffffffffffffdea0,(action_types)((ulong)in_stack_ffffffffffffde98 >> 0x20));
  local_be8 = pvVar1;
  pvVar1 = token_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  local_bf1 = 1;
  local_bf0.mRoot = (tree_node *)0x0;
  tree_type<cs::token_base_*>::tree_type(&local_bf0);
  token_expr::token_expr
            ((token_expr *)in_stack_ffffffffffffdeb0,
             (tree_type<cs::token_base_*> *)in_stack_ffffffffffffdea8);
  local_bf1 = 0;
  local_be0 = pvVar1;
  pvVar1 = token_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  token_action::token_action
            (in_stack_ffffffffffffdea0,(action_types)((ulong)in_stack_ffffffffffffde98 >> 0x20));
  local_bd8 = pvVar1;
  pvVar1 = token_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  local_c01 = 1;
  local_c00.mRoot = (tree_node *)0x0;
  tree_type<cs::token_base_*>::tree_type(&local_c00);
  token_expr::token_expr
            ((token_expr *)in_stack_ffffffffffffdeb0,
             (tree_type<cs::token_base_*> *)in_stack_ffffffffffffdea8);
  local_c01 = 0;
  local_bd0 = pvVar1;
  pvVar1 = token_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  token_endline::token_endline
            ((token_endline *)in_stack_ffffffffffffdea0,(size_t)in_stack_ffffffffffffde98);
  local_bc0 = &local_be8;
  local_bb8 = 5;
  local_bc8 = pvVar1;
  std::allocator<cs::token_base_*>::allocator((allocator<cs::token_base_*> *)0x219054);
  __l_20._M_len = in_stack_ffffffffffffdee0;
  __l_20._M_array = in_stack_ffffffffffffded8;
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::deque
            (in_stack_ffffffffffffded0,__l_20,in_stack_ffffffffffffdec8);
  method_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  method_foreach::method_foreach((method_foreach *)in_stack_ffffffffffffdea0);
  compiler_type::add_method
            (in_stack_ffffffffffffdeb0,
             (deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)in_stack_ffffffffffffdea8
             ,(method_base *)in_stack_ffffffffffffdea0);
  pvVar1 = token_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  token_action::token_action
            (in_stack_ffffffffffffdea0,(action_types)((ulong)in_stack_ffffffffffffde98 >> 0x20));
  local_ca0 = pvVar1;
  pvVar1 = token_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  local_ca9 = 1;
  local_ca8.mRoot = (tree_node *)0x0;
  tree_type<cs::token_base_*>::tree_type(&local_ca8);
  token_expr::token_expr
            ((token_expr *)in_stack_ffffffffffffdeb0,
             (tree_type<cs::token_base_*> *)in_stack_ffffffffffffdea8);
  local_ca9 = 0;
  local_c98 = pvVar1;
  pvVar1 = token_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  token_action::token_action
            (in_stack_ffffffffffffdea0,(action_types)((ulong)in_stack_ffffffffffffde98 >> 0x20));
  local_c90 = pvVar1;
  pvVar1 = token_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  local_cb9 = 1;
  local_cb8.mRoot = (tree_node *)0x0;
  tree_type<cs::token_base_*>::tree_type(&local_cb8);
  token_expr::token_expr
            ((token_expr *)in_stack_ffffffffffffdeb0,
             (tree_type<cs::token_base_*> *)in_stack_ffffffffffffdea8);
  local_cb9 = 0;
  local_c88 = pvVar1;
  pvVar1 = token_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  token_action::token_action
            (in_stack_ffffffffffffdea0,(action_types)((ulong)in_stack_ffffffffffffde98 >> 0x20));
  local_c80 = pvVar1;
  pvVar1 = token_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  local_cc9 = 1;
  local_cc8.mRoot = (tree_node *)0x0;
  tree_type<cs::token_base_*>::tree_type(&local_cc8);
  token_expr::token_expr
            ((token_expr *)in_stack_ffffffffffffdeb0,
             (tree_type<cs::token_base_*> *)in_stack_ffffffffffffdea8);
  local_cc9 = 0;
  local_c78 = pvVar1;
  pvVar1 = token_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  token_endline::token_endline
            ((token_endline *)in_stack_ffffffffffffdea0,(size_t)in_stack_ffffffffffffde98);
  local_c68 = &local_ca0;
  local_c60 = 7;
  local_c70 = pvVar1;
  std::allocator<cs::token_base_*>::allocator((allocator<cs::token_base_*> *)0x219389);
  __l_21._M_len = in_stack_ffffffffffffdee0;
  __l_21._M_array = in_stack_ffffffffffffded8;
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::deque
            (in_stack_ffffffffffffded0,__l_21,in_stack_ffffffffffffdec8);
  method_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  method_foreach_do::method_foreach_do((method_foreach_do *)in_stack_ffffffffffffdea0);
  compiler_type::add_method
            (in_stack_ffffffffffffdeb0,
             (deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)in_stack_ffffffffffffdea8
             ,(method_base *)in_stack_ffffffffffffdea0);
  pvVar1 = token_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  token_action::token_action
            (in_stack_ffffffffffffdea0,(action_types)((ulong)in_stack_ffffffffffffde98 >> 0x20));
  local_d40 = pvVar1;
  pvVar1 = token_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  token_endline::token_endline
            ((token_endline *)in_stack_ffffffffffffdea0,(size_t)in_stack_ffffffffffffde98);
  local_d30 = &local_d40;
  local_d28 = 2;
  local_d38 = pvVar1;
  std::allocator<cs::token_base_*>::allocator((allocator<cs::token_base_*> *)0x2194ab);
  __l_22._M_len = in_stack_ffffffffffffdee0;
  __l_22._M_array = in_stack_ffffffffffffded8;
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::deque
            (in_stack_ffffffffffffded0,__l_22,in_stack_ffffffffffffdec8);
  method_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  method_break::method_break((method_break *)in_stack_ffffffffffffdea0);
  compiler_type::add_method
            (in_stack_ffffffffffffdeb0,
             (deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)in_stack_ffffffffffffdea8
             ,(method_base *)in_stack_ffffffffffffdea0);
  pvVar1 = token_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  token_action::token_action
            (in_stack_ffffffffffffdea0,(action_types)((ulong)in_stack_ffffffffffffde98 >> 0x20));
  local_db8 = pvVar1;
  pvVar1 = token_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  token_endline::token_endline
            ((token_endline *)in_stack_ffffffffffffdea0,(size_t)in_stack_ffffffffffffde98);
  local_da8 = &local_db8;
  local_da0 = 2;
  local_db0 = pvVar1;
  std::allocator<cs::token_base_*>::allocator((allocator<cs::token_base_*> *)0x2195cd);
  __l_23._M_len = in_stack_ffffffffffffdee0;
  __l_23._M_array = in_stack_ffffffffffffded8;
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::deque
            (in_stack_ffffffffffffded0,__l_23,in_stack_ffffffffffffdec8);
  method_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  method_continue::method_continue((method_continue *)in_stack_ffffffffffffdea0);
  compiler_type::add_method
            (in_stack_ffffffffffffdeb0,
             (deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)in_stack_ffffffffffffdea8
             ,(method_base *)in_stack_ffffffffffffdea0);
  pvVar1 = token_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  token_action::token_action
            (in_stack_ffffffffffffdea0,(action_types)((ulong)in_stack_ffffffffffffde98 >> 0x20));
  local_e38 = pvVar1;
  pvVar1 = token_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  local_e41 = 1;
  local_e40.mRoot = (tree_node *)0x0;
  tree_type<cs::token_base_*>::tree_type(&local_e40);
  token_expr::token_expr
            ((token_expr *)in_stack_ffffffffffffdeb0,
             (tree_type<cs::token_base_*> *)in_stack_ffffffffffffdea8);
  local_e41 = 0;
  local_e30 = pvVar1;
  pvVar1 = token_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  token_endline::token_endline
            ((token_endline *)in_stack_ffffffffffffdea0,(size_t)in_stack_ffffffffffffde98);
  local_e20 = &local_e38;
  local_e18 = 3;
  local_e28 = pvVar1;
  std::allocator<cs::token_base_*>::allocator((allocator<cs::token_base_*> *)0x21976e);
  __l_24._M_len = in_stack_ffffffffffffdee0;
  __l_24._M_array = in_stack_ffffffffffffded8;
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::deque
            (in_stack_ffffffffffffded0,__l_24,in_stack_ffffffffffffdec8);
  method_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  method_function::method_function((method_function *)in_stack_ffffffffffffdea0);
  compiler_type::add_method
            (in_stack_ffffffffffffdeb0,
             (deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)in_stack_ffffffffffffdea8
             ,(method_base *)in_stack_ffffffffffffdea0);
  pvVar1 = token_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  token_action::token_action
            (in_stack_ffffffffffffdea0,(action_types)((ulong)in_stack_ffffffffffffde98 >> 0x20));
  local_ec8 = pvVar1;
  pvVar1 = token_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  local_ed1 = 1;
  local_ed0.mRoot = (tree_node *)0x0;
  tree_type<cs::token_base_*>::tree_type(&local_ed0);
  token_expr::token_expr
            ((token_expr *)in_stack_ffffffffffffdeb0,
             (tree_type<cs::token_base_*> *)in_stack_ffffffffffffdea8);
  local_ed1 = 0;
  local_ec0 = pvVar1;
  pvVar1 = token_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  token_action::token_action
            (in_stack_ffffffffffffdea0,(action_types)((ulong)in_stack_ffffffffffffde98 >> 0x20));
  local_eb8 = pvVar1;
  pvVar1 = token_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  token_endline::token_endline
            ((token_endline *)in_stack_ffffffffffffdea0,(size_t)in_stack_ffffffffffffde98);
  local_ea8 = &local_ec8;
  local_ea0 = 4;
  local_eb0 = pvVar1;
  std::allocator<cs::token_base_*>::allocator((allocator<cs::token_base_*> *)0x21995a);
  __l_25._M_len = in_stack_ffffffffffffdee0;
  __l_25._M_array = in_stack_ffffffffffffded8;
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::deque
            (in_stack_ffffffffffffded0,__l_25,in_stack_ffffffffffffdec8);
  method_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  method_function::method_function((method_function *)in_stack_ffffffffffffdea0);
  compiler_type::add_method
            (in_stack_ffffffffffffdeb0,
             (deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)in_stack_ffffffffffffdea8
             ,(method_base *)in_stack_ffffffffffffdea0);
  pvVar1 = token_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  token_action::token_action
            (in_stack_ffffffffffffdea0,(action_types)((ulong)in_stack_ffffffffffffde98 >> 0x20));
  local_f50 = pvVar1;
  pvVar1 = token_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  local_f59 = 1;
  local_f58.mRoot = (tree_node *)0x0;
  tree_type<cs::token_base_*>::tree_type(&local_f58);
  token_expr::token_expr
            ((token_expr *)in_stack_ffffffffffffdeb0,
             (tree_type<cs::token_base_*> *)in_stack_ffffffffffffdea8);
  local_f59 = 0;
  local_f48 = pvVar1;
  pvVar1 = token_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  token_endline::token_endline
            ((token_endline *)in_stack_ffffffffffffdea0,(size_t)in_stack_ffffffffffffde98);
  local_f38 = &local_f50;
  local_f30 = 3;
  local_f40 = pvVar1;
  std::allocator<cs::token_base_*>::allocator((allocator<cs::token_base_*> *)0x219afb);
  __l_26._M_len = in_stack_ffffffffffffdee0;
  __l_26._M_array = in_stack_ffffffffffffded8;
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::deque
            (in_stack_ffffffffffffded0,__l_26,in_stack_ffffffffffffdec8);
  method_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  method_return::method_return((method_return *)in_stack_ffffffffffffdea0);
  compiler_type::add_method
            (in_stack_ffffffffffffdeb0,
             (deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)in_stack_ffffffffffffdea8
             ,(method_base *)in_stack_ffffffffffffdea0);
  pvVar1 = token_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  token_action::token_action
            (in_stack_ffffffffffffdea0,(action_types)((ulong)in_stack_ffffffffffffde98 >> 0x20));
  local_fd0 = pvVar1;
  pvVar1 = token_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  token_endline::token_endline
            ((token_endline *)in_stack_ffffffffffffdea0,(size_t)in_stack_ffffffffffffde98);
  local_fc0 = &local_fd0;
  local_fb8 = 2;
  local_fc8 = pvVar1;
  std::allocator<cs::token_base_*>::allocator((allocator<cs::token_base_*> *)0x219c1d);
  __l_27._M_len = in_stack_ffffffffffffdee0;
  __l_27._M_array = in_stack_ffffffffffffded8;
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::deque
            (in_stack_ffffffffffffded0,__l_27,in_stack_ffffffffffffdec8);
  method_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  method_return_no_value::method_return_no_value
            ((method_return_no_value *)in_stack_ffffffffffffdea0);
  compiler_type::add_method
            (in_stack_ffffffffffffdeb0,
             (deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)in_stack_ffffffffffffdea8
             ,(method_base *)in_stack_ffffffffffffdea0);
  pvVar1 = token_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  token_action::token_action
            (in_stack_ffffffffffffdea0,(action_types)((ulong)in_stack_ffffffffffffde98 >> 0x20));
  local_1050 = pvVar1;
  pvVar1 = token_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  local_1059 = 1;
  local_1058.mRoot = (tree_node *)0x0;
  tree_type<cs::token_base_*>::tree_type(&local_1058);
  token_expr::token_expr
            ((token_expr *)in_stack_ffffffffffffdeb0,
             (tree_type<cs::token_base_*> *)in_stack_ffffffffffffdea8);
  local_1059 = 0;
  local_1048 = pvVar1;
  pvVar1 = token_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  token_endline::token_endline
            ((token_endline *)in_stack_ffffffffffffdea0,(size_t)in_stack_ffffffffffffde98);
  local_1038 = &local_1050;
  local_1030 = 3;
  local_1040 = pvVar1;
  std::allocator<cs::token_base_*>::allocator((allocator<cs::token_base_*> *)0x219dbe);
  __l_28._M_len = in_stack_ffffffffffffdee0;
  __l_28._M_array = in_stack_ffffffffffffded8;
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::deque
            (in_stack_ffffffffffffded0,__l_28,in_stack_ffffffffffffdec8);
  method_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  method_struct::method_struct((method_struct *)in_stack_ffffffffffffdea0);
  compiler_type::add_method
            (in_stack_ffffffffffffdeb0,
             (deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)in_stack_ffffffffffffdea8
             ,(method_base *)in_stack_ffffffffffffdea0);
  pvVar1 = token_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  token_action::token_action
            (in_stack_ffffffffffffdea0,(action_types)((ulong)in_stack_ffffffffffffde98 >> 0x20));
  local_10e8 = pvVar1;
  pvVar1 = token_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  local_10f1 = 1;
  local_10f0.mRoot = (tree_node *)0x0;
  tree_type<cs::token_base_*>::tree_type(&local_10f0);
  token_expr::token_expr
            ((token_expr *)in_stack_ffffffffffffdeb0,
             (tree_type<cs::token_base_*> *)in_stack_ffffffffffffdea8);
  local_10f1 = 0;
  local_10e0 = pvVar1;
  pvVar1 = token_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  token_action::token_action
            (in_stack_ffffffffffffdea0,(action_types)((ulong)in_stack_ffffffffffffde98 >> 0x20));
  local_10d8 = pvVar1;
  pvVar1 = token_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  local_1101 = 1;
  local_1100.mRoot = (tree_node *)0x0;
  tree_type<cs::token_base_*>::tree_type(&local_1100);
  token_expr::token_expr
            ((token_expr *)in_stack_ffffffffffffdeb0,
             (tree_type<cs::token_base_*> *)in_stack_ffffffffffffdea8);
  local_1101 = 0;
  local_10d0 = pvVar1;
  pvVar1 = token_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  token_endline::token_endline
            ((token_endline *)in_stack_ffffffffffffdea0,(size_t)in_stack_ffffffffffffde98);
  local_10c0 = &local_10e8;
  local_10b8 = 5;
  local_10c8 = pvVar1;
  std::allocator<cs::token_base_*>::allocator((allocator<cs::token_base_*> *)0x21a029);
  __l_29._M_len = in_stack_ffffffffffffdee0;
  __l_29._M_array = in_stack_ffffffffffffded8;
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::deque
            (in_stack_ffffffffffffded0,__l_29,in_stack_ffffffffffffdec8);
  method_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  method_struct::method_struct((method_struct *)in_stack_ffffffffffffdea0);
  compiler_type::add_method
            (in_stack_ffffffffffffdeb0,
             (deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)in_stack_ffffffffffffdea8
             ,(method_base *)in_stack_ffffffffffffdea0);
  pvVar1 = token_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  token_action::token_action
            (in_stack_ffffffffffffdea0,(action_types)((ulong)in_stack_ffffffffffffde98 >> 0x20));
  local_1178 = pvVar1;
  pvVar1 = token_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  token_endline::token_endline
            ((token_endline *)in_stack_ffffffffffffdea0,(size_t)in_stack_ffffffffffffde98);
  local_1168 = &local_1178;
  local_1160 = 2;
  local_1170 = pvVar1;
  std::allocator<cs::token_base_*>::allocator((allocator<cs::token_base_*> *)0x21a14b);
  __l_30._M_len = in_stack_ffffffffffffdee0;
  __l_30._M_array = in_stack_ffffffffffffded8;
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::deque
            (in_stack_ffffffffffffded0,__l_30,in_stack_ffffffffffffdec8);
  method_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  method_try::method_try((method_try *)in_stack_ffffffffffffdea0);
  compiler_type::add_method
            (in_stack_ffffffffffffdeb0,
             (deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)in_stack_ffffffffffffdea8
             ,(method_base *)in_stack_ffffffffffffdea0);
  pvVar1 = token_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  token_action::token_action
            (in_stack_ffffffffffffdea0,(action_types)((ulong)in_stack_ffffffffffffde98 >> 0x20));
  local_11f8 = pvVar1;
  pvVar1 = token_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  local_1201 = 1;
  local_1200.mRoot = (tree_node *)0x0;
  tree_type<cs::token_base_*>::tree_type(&local_1200);
  token_expr::token_expr
            ((token_expr *)in_stack_ffffffffffffdeb0,
             (tree_type<cs::token_base_*> *)in_stack_ffffffffffffdea8);
  local_1201 = 0;
  local_11f0 = pvVar1;
  pvVar1 = token_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  token_endline::token_endline
            ((token_endline *)in_stack_ffffffffffffdea0,(size_t)in_stack_ffffffffffffde98);
  local_11e0 = &local_11f8;
  local_11d8 = 3;
  local_11e8 = pvVar1;
  std::allocator<cs::token_base_*>::allocator((allocator<cs::token_base_*> *)0x21a2ec);
  __l_31._M_len = in_stack_ffffffffffffdee0;
  __l_31._M_array = in_stack_ffffffffffffded8;
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::deque
            (in_stack_ffffffffffffded0,__l_31,in_stack_ffffffffffffdec8);
  method_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  method_catch::method_catch((method_catch *)in_stack_ffffffffffffdea0);
  compiler_type::add_method
            (in_stack_ffffffffffffdeb0,
             (deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)in_stack_ffffffffffffdea8
             ,(method_base *)in_stack_ffffffffffffdea0);
  pvVar1 = token_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  token_action::token_action
            (in_stack_ffffffffffffdea0,(action_types)((ulong)in_stack_ffffffffffffde98 >> 0x20));
  local_1280 = pvVar1;
  pvVar1 = token_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  local_1289 = 1;
  local_1288.mRoot = (tree_node *)0x0;
  tree_type<cs::token_base_*>::tree_type(&local_1288);
  token_expr::token_expr
            ((token_expr *)in_stack_ffffffffffffdeb0,
             (tree_type<cs::token_base_*> *)in_stack_ffffffffffffdea8);
  local_1289 = 0;
  local_1278 = pvVar1;
  pvVar1 = token_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  token_endline::token_endline
            ((token_endline *)in_stack_ffffffffffffdea0,(size_t)in_stack_ffffffffffffde98);
  local_1268 = &local_1280;
  local_1260 = 3;
  local_1270 = pvVar1;
  std::allocator<cs::token_base_*>::allocator((allocator<cs::token_base_*> *)0x21a48d);
  __l_32._M_len = in_stack_ffffffffffffdee0;
  __l_32._M_array = in_stack_ffffffffffffded8;
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::deque
            (in_stack_ffffffffffffded0,__l_32,in_stack_ffffffffffffdec8);
  uVar5 = (undefined1)((ulong)in_stack_ffffffffffffded0 >> 0x38);
  method_base::operator_new((size_t)in_stack_ffffffffffffdea0);
  method_throw::method_throw((method_throw *)in_stack_ffffffffffffdea0);
  compiler_type::add_method
            (in_stack_ffffffffffffdeb0,
             (deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)in_stack_ffffffffffffdea8
             ,(method_base *)in_stack_ffffffffffffdea0);
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~deque(in_stack_ffffffffffffdef0)
  ;
  std::allocator<cs::token_base_*>::~allocator((allocator<cs::token_base_*> *)0x21a50e);
  tree_type<cs::token_base_*>::~tree_type((tree_type<cs::token_base_*> *)0x21a51b);
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~deque(in_stack_ffffffffffffdef0)
  ;
  std::allocator<cs::token_base_*>::~allocator((allocator<cs::token_base_*> *)0x21a535);
  tree_type<cs::token_base_*>::~tree_type((tree_type<cs::token_base_*> *)0x21a542);
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~deque(in_stack_ffffffffffffdef0)
  ;
  std::allocator<cs::token_base_*>::~allocator((allocator<cs::token_base_*> *)0x21a55c);
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~deque(in_stack_ffffffffffffdef0)
  ;
  std::allocator<cs::token_base_*>::~allocator((allocator<cs::token_base_*> *)0x21a576);
  tree_type<cs::token_base_*>::~tree_type((tree_type<cs::token_base_*> *)0x21a583);
  tree_type<cs::token_base_*>::~tree_type((tree_type<cs::token_base_*> *)0x21a590);
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~deque(in_stack_ffffffffffffdef0)
  ;
  std::allocator<cs::token_base_*>::~allocator((allocator<cs::token_base_*> *)0x21a5aa);
  tree_type<cs::token_base_*>::~tree_type((tree_type<cs::token_base_*> *)0x21a5b7);
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~deque(in_stack_ffffffffffffdef0)
  ;
  std::allocator<cs::token_base_*>::~allocator((allocator<cs::token_base_*> *)0x21a5d1);
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~deque(in_stack_ffffffffffffdef0)
  ;
  std::allocator<cs::token_base_*>::~allocator((allocator<cs::token_base_*> *)0x21a5eb);
  tree_type<cs::token_base_*>::~tree_type((tree_type<cs::token_base_*> *)0x21a5f8);
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~deque(in_stack_ffffffffffffdef0)
  ;
  std::allocator<cs::token_base_*>::~allocator((allocator<cs::token_base_*> *)0x21a612);
  tree_type<cs::token_base_*>::~tree_type((tree_type<cs::token_base_*> *)0x21a61f);
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~deque(in_stack_ffffffffffffdef0)
  ;
  std::allocator<cs::token_base_*>::~allocator((allocator<cs::token_base_*> *)0x21a639);
  tree_type<cs::token_base_*>::~tree_type((tree_type<cs::token_base_*> *)0x21a646);
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~deque(in_stack_ffffffffffffdef0)
  ;
  std::allocator<cs::token_base_*>::~allocator((allocator<cs::token_base_*> *)0x21a660);
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~deque(in_stack_ffffffffffffdef0)
  ;
  std::allocator<cs::token_base_*>::~allocator((allocator<cs::token_base_*> *)0x21a67a);
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~deque(in_stack_ffffffffffffdef0)
  ;
  std::allocator<cs::token_base_*>::~allocator((allocator<cs::token_base_*> *)0x21a694);
  tree_type<cs::token_base_*>::~tree_type((tree_type<cs::token_base_*> *)0x21a6a1);
  tree_type<cs::token_base_*>::~tree_type((tree_type<cs::token_base_*> *)0x21a6ae);
  tree_type<cs::token_base_*>::~tree_type((tree_type<cs::token_base_*> *)0x21a6bb);
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~deque(in_stack_ffffffffffffdef0)
  ;
  std::allocator<cs::token_base_*>::~allocator((allocator<cs::token_base_*> *)0x21a6d5);
  tree_type<cs::token_base_*>::~tree_type((tree_type<cs::token_base_*> *)0x21a6e2);
  tree_type<cs::token_base_*>::~tree_type((tree_type<cs::token_base_*> *)0x21a6ef);
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~deque(in_stack_ffffffffffffdef0)
  ;
  std::allocator<cs::token_base_*>::~allocator((allocator<cs::token_base_*> *)0x21a709);
  tree_type<cs::token_base_*>::~tree_type((tree_type<cs::token_base_*> *)0x21a716);
  tree_type<cs::token_base_*>::~tree_type((tree_type<cs::token_base_*> *)0x21a723);
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~deque(in_stack_ffffffffffffdef0)
  ;
  std::allocator<cs::token_base_*>::~allocator((allocator<cs::token_base_*> *)0x21a73d);
  tree_type<cs::token_base_*>::~tree_type((tree_type<cs::token_base_*> *)0x21a74a);
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~deque(in_stack_ffffffffffffdef0)
  ;
  std::allocator<cs::token_base_*>::~allocator((allocator<cs::token_base_*> *)0x21a764);
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~deque(in_stack_ffffffffffffdef0)
  ;
  std::allocator<cs::token_base_*>::~allocator((allocator<cs::token_base_*> *)0x21a77e);
  tree_type<cs::token_base_*>::~tree_type((tree_type<cs::token_base_*> *)0x21a78b);
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~deque(in_stack_ffffffffffffdef0)
  ;
  std::allocator<cs::token_base_*>::~allocator((allocator<cs::token_base_*> *)0x21a7a5);
  tree_type<cs::token_base_*>::~tree_type((tree_type<cs::token_base_*> *)0x21a7b2);
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~deque(in_stack_ffffffffffffdef0)
  ;
  std::allocator<cs::token_base_*>::~allocator((allocator<cs::token_base_*> *)0x21a7cc);
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~deque(in_stack_ffffffffffffdef0)
  ;
  std::allocator<cs::token_base_*>::~allocator((allocator<cs::token_base_*> *)0x21a7e6);
  tree_type<cs::token_base_*>::~tree_type((tree_type<cs::token_base_*> *)0x21a7f3);
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~deque(in_stack_ffffffffffffdef0)
  ;
  std::allocator<cs::token_base_*>::~allocator((allocator<cs::token_base_*> *)0x21a80d);
  tree_type<cs::token_base_*>::~tree_type((tree_type<cs::token_base_*> *)0x21a81a);
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~deque(in_stack_ffffffffffffdef0)
  ;
  std::allocator<cs::token_base_*>::~allocator((allocator<cs::token_base_*> *)0x21a834);
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~deque(in_stack_ffffffffffffdef0)
  ;
  std::allocator<cs::token_base_*>::~allocator((allocator<cs::token_base_*> *)0x21a84e);
  tree_type<cs::token_base_*>::~tree_type((tree_type<cs::token_base_*> *)0x21a85b);
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~deque(in_stack_ffffffffffffdef0)
  ;
  std::allocator<cs::token_base_*>::~allocator((allocator<cs::token_base_*> *)0x21a875);
  tree_type<cs::token_base_*>::~tree_type((tree_type<cs::token_base_*> *)0x21a882);
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~deque(in_stack_ffffffffffffdef0)
  ;
  std::allocator<cs::token_base_*>::~allocator((allocator<cs::token_base_*> *)0x21a89c);
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~deque(in_stack_ffffffffffffdef0)
  ;
  std::allocator<cs::token_base_*>::~allocator((allocator<cs::token_base_*> *)0x21a8b6);
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~deque(in_stack_ffffffffffffdef0)
  ;
  std::allocator<cs::token_base_*>::~allocator((allocator<cs::token_base_*> *)0x21a8d0);
  tree_type<cs::token_base_*>::~tree_type((tree_type<cs::token_base_*> *)0x21a8dd);
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~deque(in_stack_ffffffffffffdef0)
  ;
  std::allocator<cs::token_base_*>::~allocator((allocator<cs::token_base_*> *)0x21a8f7);
  tree_type<cs::token_base_*>::~tree_type((tree_type<cs::token_base_*> *)0x21a904);
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~deque(in_stack_ffffffffffffdef0)
  ;
  std::allocator<cs::token_base_*>::~allocator((allocator<cs::token_base_*> *)0x21a91e);
  tree_type<cs::token_base_*>::~tree_type((tree_type<cs::token_base_*> *)0x21a92b);
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~deque(in_stack_ffffffffffffdef0)
  ;
  std::allocator<cs::token_base_*>::~allocator((allocator<cs::token_base_*> *)0x21a945);
  tree_type<cs::token_base_*>::~tree_type((tree_type<cs::token_base_*> *)0x21a952);
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~deque(in_stack_ffffffffffffdef0)
  ;
  std::allocator<cs::token_base_*>::~allocator((allocator<cs::token_base_*> *)0x21a96c);
  tree_type<cs::token_base_*>::~tree_type((tree_type<cs::token_base_*> *)0x21a979);
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~deque(in_stack_ffffffffffffdef0)
  ;
  std::allocator<cs::token_base_*>::~allocator((allocator<cs::token_base_*> *)0x21a993);
  tree_type<cs::token_base_*>::~tree_type((tree_type<cs::token_base_*> *)0x21a9a0);
  tree_type<cs::token_base_*>::~tree_type((tree_type<cs::token_base_*> *)0x21a9ad);
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~deque(in_stack_ffffffffffffdef0)
  ;
  std::allocator<cs::token_base_*>::~allocator((allocator<cs::token_base_*> *)0x21a9c7);
  tree_type<cs::token_base_*>::~tree_type((tree_type<cs::token_base_*> *)0x21a9d4);
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~deque(in_stack_ffffffffffffdef0)
  ;
  std::allocator<cs::token_base_*>::~allocator((allocator<cs::token_base_*> *)0x21a9ee);
  tree_type<cs::token_base_*>::~tree_type((tree_type<cs::token_base_*> *)0x21a9fb);
  std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x21aa08);
  std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x21aa14);
  std::function<cs_impl::any()>::
  function<cs::create_context(std::deque<cs_impl::any,std::allocator<cs_impl::any>>const&)::__0,void>
            ((function<cs_impl::any_()> *)in_stack_ffffffffffffdeb0,in_stack_ffffffffffffdea8);
  std::type_index::type_index(local_12c0,(type_info *)&char::typeinfo);
  std::shared_ptr<cs::name_space>::shared_ptr
            ((shared_ptr<cs::name_space> *)in_stack_ffffffffffffdea0,
             (shared_ptr<cs::name_space> *)in_stack_ffffffffffffde98);
  domain_manager::add_buildin_type<char_const(&)[5]>
            (in_stack_ffffffffffffdf40,(char (*) [5])in_stack_ffffffffffffdf38,
             (function<cs_impl::any_()> *)in_stack_ffffffffffffdf30,in_stack_ffffffffffffdf28,
             (namespace_t *)in_stack_ffffffffffffdf20);
  std::function<cs_impl::any()>::
  function<cs::create_context(std::deque<cs_impl::any,std::allocator<cs_impl::any>>const&)::__1,void>
            ((function<cs_impl::any_()> *)in_stack_ffffffffffffdeb0,in_stack_ffffffffffffdea8);
  std::type_index::type_index(local_1300,(type_info *)&numeric::typeinfo);
  std::shared_ptr<cs::name_space>::shared_ptr
            ((shared_ptr<cs::name_space> *)in_stack_ffffffffffffdea0,
             (shared_ptr<cs::name_space> *)in_stack_ffffffffffffde98);
  domain_manager::add_buildin_type<char_const(&)[7]>
            (in_stack_ffffffffffffdf40,(char (*) [7])in_stack_ffffffffffffdf38,
             (function<cs_impl::any_()> *)in_stack_ffffffffffffdf30,in_stack_ffffffffffffdf28,
             (namespace_t *)in_stack_ffffffffffffdf20);
  std::function<cs_impl::any()>::
  function<cs::create_context(std::deque<cs_impl::any,std::allocator<cs_impl::any>>const&)::__2,void>
            ((function<cs_impl::any_()> *)in_stack_ffffffffffffdeb0,in_stack_ffffffffffffdea8);
  std::type_index::type_index(local_1340,(type_info *)&numeric::typeinfo);
  domain_manager::add_buildin_type<char_const(&)[8]>
            (in_stack_ffffffffffffdf30,(char (*) [8])in_stack_ffffffffffffdf28,
             in_stack_ffffffffffffdf20,in_stack_ffffffffffffdf18);
  std::function<cs_impl::any()>::
  function<cs::create_context(std::deque<cs_impl::any,std::allocator<cs_impl::any>>const&)::__3,void>
            ((function<cs_impl::any_()> *)in_stack_ffffffffffffdeb0,in_stack_ffffffffffffdea8);
  std::type_index::type_index(local_1370,(type_info *)&numeric::typeinfo);
  domain_manager::add_buildin_type<char_const(&)[6]>
            (in_stack_ffffffffffffdf30,(char (*) [6])in_stack_ffffffffffffdf28,
             in_stack_ffffffffffffdf20,in_stack_ffffffffffffdf18);
  std::function<cs_impl::any()>::
  function<cs::create_context(std::deque<cs_impl::any,std::allocator<cs_impl::any>>const&)::__4,void>
            ((function<cs_impl::any_()> *)in_stack_ffffffffffffdeb0,in_stack_ffffffffffffdea8);
  std::type_index::type_index(local_13a0,(type_info *)&bool::typeinfo);
  domain_manager::add_buildin_type<char_const(&)[8]>
            (in_stack_ffffffffffffdf30,(char (*) [8])in_stack_ffffffffffffdf28,
             in_stack_ffffffffffffdf20,in_stack_ffffffffffffdf18);
  std::function<cs_impl::any()>::
  function<cs::create_context(std::deque<cs_impl::any,std::allocator<cs_impl::any>>const&)::__5,void>
            ((function<cs_impl::any_()> *)in_stack_ffffffffffffdeb0,in_stack_ffffffffffffdea8);
  std::type_index::type_index(local_13d0,(type_info *)&pointer::typeinfo);
  domain_manager::add_buildin_type<char_const(&)[8]>
            (in_stack_ffffffffffffdf30,(char (*) [8])in_stack_ffffffffffffdf28,
             in_stack_ffffffffffffdf20,in_stack_ffffffffffffdf18);
  std::function<cs_impl::any()>::
  function<cs::create_context(std::deque<cs_impl::any,std::allocator<cs_impl::any>>const&)::__6,void>
            ((function<cs_impl::any_()> *)in_stack_ffffffffffffdeb0,in_stack_ffffffffffffdea8);
  std::type_index::type_index(local_1400,(type_info *)&std::__cxx11::string::typeinfo);
  std::shared_ptr<cs::name_space>::shared_ptr
            ((shared_ptr<cs::name_space> *)in_stack_ffffffffffffdea0,
             (shared_ptr<cs::name_space> *)in_stack_ffffffffffffde98);
  domain_manager::add_buildin_type<char_const(&)[7]>
            (in_stack_ffffffffffffdf40,(char (*) [7])in_stack_ffffffffffffdf38,
             (function<cs_impl::any_()> *)in_stack_ffffffffffffdf30,in_stack_ffffffffffffdf28,
             (namespace_t *)in_stack_ffffffffffffdf20);
  std::function<cs_impl::any()>::
  function<cs::create_context(std::deque<cs_impl::any,std::allocator<cs_impl::any>>const&)::__7,void>
            ((function<cs_impl::any_()> *)in_stack_ffffffffffffdeb0,in_stack_ffffffffffffdea8);
  std::type_index::type_index
            ((type_index *)
             &local_14b0.buildin_symbols.
              super_raw_hash_set<phmap::priv::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .capacity_,
             (type_info *)&std::__cxx11::list<cs_impl::any,std::allocator<cs_impl::any>>::typeinfo);
  std::shared_ptr<cs::name_space>::shared_ptr
            ((shared_ptr<cs::name_space> *)in_stack_ffffffffffffdea0,
             (shared_ptr<cs::name_space> *)in_stack_ffffffffffffde98);
  domain_manager::add_buildin_type<char_const(&)[5]>
            (in_stack_ffffffffffffdf40,(char (*) [5])in_stack_ffffffffffffdf38,
             (function<cs_impl::any_()> *)in_stack_ffffffffffffdf30,in_stack_ffffffffffffdf28,
             (namespace_t *)in_stack_ffffffffffffdf20);
  std::function<cs_impl::any()>::
  function<cs::create_context(std::deque<cs_impl::any,std::allocator<cs_impl::any>>const&)::__8,void>
            ((function<cs_impl::any_()> *)in_stack_ffffffffffffdeb0,in_stack_ffffffffffffdea8);
  std::type_index::type_index
            ((type_index *)&local_14b0.m_data,
             (type_info *)&std::deque<cs_impl::any,std::allocator<cs_impl::any>>::typeinfo);
  std::shared_ptr<cs::name_space>::shared_ptr
            ((shared_ptr<cs::name_space> *)in_stack_ffffffffffffdea0,
             (shared_ptr<cs::name_space> *)in_stack_ffffffffffffde98);
  domain_manager::add_buildin_type<char_const(&)[6]>
            (in_stack_ffffffffffffdf40,(char (*) [6])in_stack_ffffffffffffdf38,
             (function<cs_impl::any_()> *)in_stack_ffffffffffffdf30,in_stack_ffffffffffffdf28,
             (namespace_t *)in_stack_ffffffffffffdf20);
  pdVar3 = &local_14b0;
  std::function<cs_impl::any()>::
  function<cs::create_context(std::deque<cs_impl::any,std::allocator<cs_impl::any>>const&)::__9,void>
            ((function<cs_impl::any_()> *)in_stack_ffffffffffffdeb0,in_stack_ffffffffffffdea8);
  std::type_index::type_index
            (local_14c0,(type_info *)&std::pair<cs_impl::any,cs_impl::any>::typeinfo);
  std::shared_ptr<cs::name_space>::shared_ptr
            ((shared_ptr<cs::name_space> *)in_stack_ffffffffffffdea0,
             (shared_ptr<cs::name_space> *)in_stack_ffffffffffffde98);
  domain_manager::add_buildin_type<char_const(&)[5]>
            (pdVar3,(char (*) [5])in_stack_ffffffffffffdf38,
             (function<cs_impl::any_()> *)in_stack_ffffffffffffdf30,in_stack_ffffffffffffdf28,
             (namespace_t *)in_stack_ffffffffffffdf20);
  ext = local_14f0;
  std::function<cs_impl::any()>::
  function<cs::create_context(std::deque<cs_impl::any,std::allocator<cs_impl::any>>const&)::__10,void>
            ((function<cs_impl::any_()> *)in_stack_ffffffffffffdeb0,in_stack_ffffffffffffdea8);
  this_01 = local_1500;
  std::type_index::type_index
            (this_01,(type_info *)
                     &phmap::
                      flat_hash_set<cs_impl::any,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<cs_impl::any>>
                      ::typeinfo);
  func = (function<cs_impl::any_()> *)(local_1550 + 0x40);
  std::shared_ptr<cs::name_space>::shared_ptr
            ((shared_ptr<cs::name_space> *)in_stack_ffffffffffffdea0,
             (shared_ptr<cs::name_space> *)in_stack_ffffffffffffde98);
  pdVar2 = domain_manager::add_buildin_type<char_const(&)[9]>
                     (pdVar3,in_stack_ffffffffffffdf38,func,this_01,ext);
  var = (var *)(local_1550 + 0x20);
  std::function<cs_impl::any()>::
  function<cs::create_context(std::deque<cs_impl::any,std::allocator<cs_impl::any>>const&)::__11,void>
            ((function<cs_impl::any_()> *)in_stack_ffffffffffffdeb0,in_stack_ffffffffffffdea8);
  this = (type_index *)(local_1550 + 0x10);
  std::type_index::type_index
            (this,(type_info *)
                  &phmap::
                   flat_hash_map<cs_impl::any,cs_impl::any,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<std::pair<cs_impl::any_const,cs_impl::any>>>
                   ::typeinfo);
  this_00 = (domain_manager *)local_1550;
  std::shared_ptr<cs::name_space>::shared_ptr
            ((shared_ptr<cs::name_space> *)in_stack_ffffffffffffdea0,
             (shared_ptr<cs::name_space> *)in_stack_ffffffffffffde98);
  domain_manager::add_buildin_type<char_const(&)[9]>(pdVar3,(char (*) [9])pdVar2,func,this_01,ext);
  cs_impl::any::make_constant<std::shared_ptr<cs::context_type>,std::shared_ptr<cs::context_type>&>
            ((shared_ptr<cs::context_type> *)in_stack_ffffffffffffdeb8);
  domain_manager::add_buildin_var<char_const(&)[8]>(this_00,(char (*) [8])this,var);
  cs_impl::any::
  make_protect<cs::callable,cs_impl::any(&)(std::vector<cs_impl::any,std::allocator<cs_impl::any>>&),cs::callable::types>
            ((_func_any_vector<cs_impl::any,_std::allocator<cs_impl::any>_>_ptr *)
             in_stack_ffffffffffffdeb8,(types *)in_stack_ffffffffffffdeb0);
  domain_manager::add_buildin_var<char_const(&)[6]>(this_00,(char (*) [6])this,var);
  make_cni<cs::numeric(&)(cs_impl::any_const&)>
            ((_func_numeric_any_ptr *)in_stack_ffffffffffffded8,(bool)uVar5);
  domain_manager::add_buildin_var<char_const(&)[11]>(this_00,(char (*) [11])this,var);
  make_cni<std::__cxx11::string(&)(cs_impl::any_const&)>
            ((_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_any_ptr *)
             in_stack_ffffffffffffded8,(bool)uVar5);
  domain_manager::add_buildin_var<char_const(&)[10]>(this_00,(char (*) [10])this,var);
  make_cni<std::__cxx11::string(&)(cs_impl::any_const&)>
            ((_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_any_ptr *)
             in_stack_ffffffffffffded8,(bool)uVar5);
  pdVar3 = domain_manager::add_buildin_var<char_const(&)[5]>(this_00,(char (*) [5])this,var);
  make_cni<cs_impl::any(&)(cs_impl::any_const&)>((_func_any_any_ptr *)pdVar3,(bool)uVar5);
  pdVar2 = domain_manager::add_buildin_var<char_const(&)[6]>(this_00,(char (*) [6])this,var);
  uVar5 = (undefined1)((ulong)pdVar2 >> 0x38);
  make_cni<cs_impl::any(&)(cs_impl::any_const&)>((_func_any_any_ptr *)pdVar3,(bool)uVar5);
  domain_manager::add_buildin_var<char_const(&)[5]>(this_00,(char (*) [5])this,var);
  make_cni<void(&)(cs_impl::any&,cs_impl::any&)>((_func_void_any_ptr_any_ptr *)pdVar3,(bool)uVar5);
  domain_manager::add_buildin_var<char_const(&)[5]>(this_00,(char (*) [5])this,var);
  make_cni<bool(&)(cs::type_id_const&,cs::type_id_const&)>
            ((_func_bool_type_id_ptr_type_id_ptr *)pdVar3,(bool)uVar5);
  domain_manager::add_buildin_var<char_const(&)[5]>(this_00,(char (*) [5])this,var);
  make_namespace((namespace_t *)in_stack_ffffffffffffde98);
  domain_manager::add_buildin_var<char_const(&)[10]>(this_00,(char (*) [10])this,var);
  make_namespace((namespace_t *)in_stack_ffffffffffffde98);
  domain_manager::add_buildin_var<char_const(&)[9]>(this_00,(char (*) [9])this,var);
  make_namespace((namespace_t *)in_stack_ffffffffffffde98);
  domain_manager::add_buildin_var<char_const(&)[7]>(this_00,(char (*) [7])this,var);
  make_namespace((namespace_t *)in_stack_ffffffffffffde98);
  pdVar3 = domain_manager::add_buildin_var<char_const(&)[8]>(this_00,(char (*) [8])this,var);
  make_namespace((namespace_t *)pdVar3);
  domain_manager::add_buildin_var<char_const(&)[5]>(this_00,(char (*) [5])this,var);
  cs_impl::any::~any((any *)0x21b330);
  cs_impl::any::~any((any *)0x21b33d);
  cs_impl::any::~any((any *)0x21b34a);
  cs_impl::any::~any((any *)0x21b357);
  cs_impl::any::~any((any *)0x21b364);
  cs_impl::any::~any((any *)0x21b371);
  cs_impl::any::~any((any *)0x21b37e);
  cs_impl::any::~any((any *)0x21b38b);
  cs_impl::any::~any((any *)0x21b398);
  cs_impl::any::~any((any *)0x21b3a5);
  cs_impl::any::~any((any *)0x21b3b2);
  cs_impl::any::~any((any *)0x21b3bf);
  cs_impl::any::~any((any *)0x21b3cc);
  cs_impl::any::~any((any *)0x21b3d9);
  std::shared_ptr<cs::name_space>::~shared_ptr((shared_ptr<cs::name_space> *)0x21b3e6);
  std::function<cs_impl::any_()>::~function((function<cs_impl::any_()> *)0x21b3f3);
  std::shared_ptr<cs::name_space>::~shared_ptr((shared_ptr<cs::name_space> *)0x21b400);
  std::function<cs_impl::any_()>::~function((function<cs_impl::any_()> *)0x21b40d);
  std::shared_ptr<cs::name_space>::~shared_ptr((shared_ptr<cs::name_space> *)0x21b41a);
  std::function<cs_impl::any_()>::~function((function<cs_impl::any_()> *)0x21b427);
  std::shared_ptr<cs::name_space>::~shared_ptr((shared_ptr<cs::name_space> *)0x21b434);
  std::function<cs_impl::any_()>::~function((function<cs_impl::any_()> *)0x21b441);
  std::shared_ptr<cs::name_space>::~shared_ptr((shared_ptr<cs::name_space> *)0x21b44e);
  std::function<cs_impl::any_()>::~function((function<cs_impl::any_()> *)0x21b45b);
  std::shared_ptr<cs::name_space>::~shared_ptr((shared_ptr<cs::name_space> *)0x21b468);
  std::function<cs_impl::any_()>::~function((function<cs_impl::any_()> *)0x21b475);
  std::function<cs_impl::any_()>::~function((function<cs_impl::any_()> *)0x21b482);
  std::function<cs_impl::any_()>::~function((function<cs_impl::any_()> *)0x21b48f);
  std::function<cs_impl::any_()>::~function((function<cs_impl::any_()> *)0x21b49c);
  std::function<cs_impl::any_()>::~function((function<cs_impl::any_()> *)0x21b4a9);
  std::shared_ptr<cs::name_space>::~shared_ptr((shared_ptr<cs::name_space> *)0x21b4b6);
  std::function<cs_impl::any_()>::~function((function<cs_impl::any_()> *)0x21b4c3);
  std::shared_ptr<cs::name_space>::~shared_ptr((shared_ptr<cs::name_space> *)0x21b4d0);
  std::function<cs_impl::any_()>::~function((function<cs_impl::any_()> *)0x21b4dd);
  cVar4.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  cVar4.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (context_t)cVar4.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

context_t create_context(const array &args)
	{
		cs_impl::init_extensions();
		context_t context = std::make_shared<context_type>();
		context->compiler = std::make_shared<compiler_type>(context);
		context->instance = std::make_shared<instance_type>(context, current_process->stack_size);
		context->cmd_args = cs::var::make_constant<cs::array>(args);
		// Init Grammars
		(*context->compiler)
		// Expression Grammar
		.add_method({new token_expr(tree_type<token_base *>()), new token_endline(0)},
		new method_expression)
		// Import Grammar
		.add_method({new token_action(action_types::import_), new token_expr(tree_type<token_base *>()),
			            new token_endline(0)}, new method_import)
		.add_method({new token_action(action_types::import_), new token_expr(tree_type<token_base *>()),
			            new token_action(action_types::as_), new token_expr(tree_type<token_base *>()),
			            new token_endline(0)}, new method_import_as)
		// Package Grammar
		.add_method({new token_action(action_types::package_), new token_expr(tree_type<token_base *>()),
			            new token_endline(0)}, new method_package)
		// Involve Grammar
		.add_method({new token_action(action_types::using_), new token_expr(tree_type<token_base *>()),
			            new token_endline(0)}, new method_involve)
		// Var Grammar
		.add_method({new token_action(action_types::var_), new token_expr(tree_type<token_base *>()),
			            new token_endline(0)}, new method_var)
		.add_method({new token_action(action_types::link_), new token_expr(tree_type<token_base *>()),
			            new token_endline(0)}, new method_link)
		.add_method({new token_action(action_types::constant_), new token_expr(tree_type<token_base *>()),
			            new token_endline(0)},
		new method_constant)
		// End Grammar
		.add_method({new token_action(action_types::endblock_), new token_endline(0)}, new method_end)
		// Block Grammar
		.add_method({new token_action(action_types::block_), new token_endline(0)}, new method_block)
		// Namespace Grammar
		.add_method({new token_action(action_types::namespace_), new token_expr(tree_type<token_base *>()),
			            new token_endline(0)}, new method_namespace)
		// If Grammar
		.add_method({new token_action(action_types::if_), new token_expr(tree_type<token_base *>()),
			            new token_endline(0)}, new method_if)
		// Else Grammar
		.add_method({new token_action(action_types::else_), new token_endline(0)}, new method_else)
		// Switch Grammar
		.add_method({new token_action(action_types::switch_), new token_expr(tree_type<token_base *>()),
			            new token_endline(0)}, new method_switch)
		// Case Grammar
		.add_method({new token_action(action_types::case_), new token_expr(tree_type<token_base *>()),
			            new token_endline(0)}, new method_case)
		// Default Grammar
		.add_method({new token_action(action_types::default_), new token_endline(0)},
		new method_default)
		// While Grammar
		.add_method({new token_action(action_types::while_), new token_expr(tree_type<token_base *>()),
			            new token_endline(0)}, new method_while)
		// Until Grammar
		.add_method({new token_action(action_types::until_), new token_expr(tree_type<token_base *>()),
			            new token_endline(0)}, new method_until)
		// Loop Grammar
		.add_method({new token_action(action_types::loop_), new token_endline(0)}, new method_loop)
		// For Grammar
		.add_method({new token_action(action_types::for_), new token_expr(tree_type<token_base *>()),
			            new token_endline(0)}, new method_for)
		.add_method({new token_action(action_types::for_), new token_expr(tree_type<token_base *>()),
			            new token_action(action_types::do_), new token_expr(tree_type<token_base *>()),
			            new token_endline(0)}, new method_for_do)
		.add_method({new token_action(action_types::foreach_), new token_expr(tree_type<token_base *>()),
			            new token_action(action_types::in_), new token_expr(tree_type<token_base *>()),
			            new token_endline(0)}, new method_foreach)
		.add_method({new token_action(action_types::foreach_), new token_expr(tree_type<token_base *>()),
			            new token_action(action_types::in_), new token_expr(tree_type<token_base *>()),
			            new token_action(action_types::do_), new token_expr(tree_type<token_base *>()),
			            new token_endline(0)}, new method_foreach_do)
		// Break Grammar
		.add_method({new token_action(action_types::break_), new token_endline(0)}, new method_break)
		// Continue Grammar
		.add_method({new token_action(action_types::continue_), new token_endline(0)},
		new method_continue)
		// Function Grammar
		.add_method({new token_action(action_types::function_), new token_expr(tree_type<token_base *>()),
			            new token_endline(0)}, new method_function)
		.add_method({new token_action(action_types::function_), new token_expr(tree_type<token_base *>()),
			            new token_action(action_types::override_), new token_endline(0)},
		new method_function)
		// Return Grammar
		.add_method({new token_action(action_types::return_), new token_expr(tree_type<token_base *>()),
			            new token_endline(0)}, new method_return)
		.add_method({new token_action(action_types::return_), new token_endline(0)},
		new method_return_no_value)
		// Struct Grammar
		.add_method({new token_action(action_types::struct_), new token_expr(tree_type<token_base *>()),
			            new token_endline(0)}, new method_struct)
		.add_method({new token_action(action_types::struct_), new token_expr(tree_type<token_base *>()),
			            new token_action(action_types::extends_), new token_expr(tree_type<token_base *>()),
			            new token_endline(0)}, new method_struct)
		// Try Grammar
		.add_method({new token_action(action_types::try_), new token_endline(0)}, new method_try)
		// Catch Grammar
		.add_method({new token_action(action_types::catch_), new token_expr(tree_type<token_base *>()),
			            new token_endline(0)}, new method_catch)
		// Throw Grammar
		.add_method({new token_action(action_types::throw_), new token_expr(tree_type<token_base *>()),
			            new token_endline(0)}, new method_throw);
		// Init Runtime
		context->instance->storage
		// Internal Types
		.add_buildin_type("char", []() -> var { return var::make<char>('\0'); }, typeid(char),
		                  cs_impl::char_ext)
		.add_buildin_type("number", []() -> var { return var::make<numeric>(0); }, typeid(numeric),
		                  cs_impl::number_ext)
		.add_buildin_type("integer", []() -> var { return var::make<numeric>(0); }, typeid(numeric))
		.add_buildin_type("float", []() -> var { return var::make<numeric>(0.0); }, typeid(numeric))
		.add_buildin_type("boolean", []() -> var { return var::make<boolean>(true); }, typeid(boolean))
		.add_buildin_type("pointer", []() -> var { return var::make<pointer>(null_pointer); }, typeid(pointer))
		.add_buildin_type("string", []() -> var { return var::make<string>(); }, typeid(string),
		                  cs_impl::string_ext)
		.add_buildin_type("list", []() -> var { return var::make<list>(); }, typeid(list), cs_impl::list_ext)
		.add_buildin_type("array", []() -> var { return var::make<array>(); }, typeid(array),
		                  cs_impl::array_ext)
		.add_buildin_type("pair", []() -> var { return var::make<pair>(numeric(0), numeric(0)); }, typeid(pair),
		                  cs_impl::pair_ext)
		.add_buildin_type("hash_set", []() -> var { return var::make<hash_set>(); }, typeid(hash_set),
		                  cs_impl::hash_set_ext)
		.add_buildin_type("hash_map", []() -> var { return var::make<hash_map>(); }, typeid(hash_map),
		                  cs_impl::hash_map_ext)
		// Context
		.add_buildin_var("context", var::make_constant<context_t>(context))
		// Add Internal Functions to storage
		.add_buildin_var("range", var::make_protect<callable>(range, callable::types::request_fold))
		.add_buildin_var("to_integer", make_cni(to_integer, true))
		.add_buildin_var("to_string", make_cni(to_string, true))
		.add_buildin_var("type", make_cni(type, true))
		.add_buildin_var("clone", make_cni(clone))
		.add_buildin_var("move", make_cni(move))
		.add_buildin_var("swap", make_cni(swap, true))
		.add_buildin_var("is_a", make_cni(is_a, true))
		// Add extensions to storage
		.add_buildin_var("exception", make_namespace(cs_impl::except_ext))
		.add_buildin_var("iostream", make_namespace(cs_impl::iostream_ext))
		.add_buildin_var("system", make_namespace(cs_impl::system_ext))
		.add_buildin_var("runtime", make_namespace(cs_impl::runtime_ext))
		.add_buildin_var("math", make_namespace(cs_impl::math_ext));
		return context;
	}